

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_push_custom(nk_command_buffer *b,nk_rect r,nk_command_custom_callback cb,nk_handle usr)

{
  float fVar1;
  float fVar2;
  float fVar3;
  void *pvVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar7 = r.w;
  fVar8 = r.h;
  fVar5 = r.x;
  fVar6 = r.y;
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x2367,
                  "void nk_push_custom(struct nk_command_buffer *, struct nk_rect, nk_command_custom_callback, nk_handle)"
                 );
  }
  if (b->use_clipping != 0) {
    fVar1 = (b->clip).w;
    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
      return;
    }
    fVar2 = (b->clip).h;
    if ((fVar2 == 0.0) && (!NAN(fVar2))) {
      return;
    }
    fVar3 = (b->clip).x;
    if (fVar5 + fVar7 < fVar3) {
      return;
    }
    if (fVar1 + fVar3 < fVar5) {
      return;
    }
    fVar1 = (b->clip).y;
    if (fVar6 + fVar8 < fVar1) {
      return;
    }
    if (fVar2 + fVar1 < fVar6) {
      return;
    }
  }
  pvVar4 = nk_command_buffer_push(b,NK_COMMAND_CUSTOM,0x28);
  if (pvVar4 != (void *)0x0) {
    *(short *)((long)pvVar4 + 0x10) = (short)(int)fVar5;
    *(short *)((long)pvVar4 + 0x12) = (short)(int)fVar6;
    if (fVar7 <= 0.0) {
      fVar7 = 0.0;
    }
    if (fVar8 <= 0.0) {
      fVar8 = 0.0;
    }
    *(short *)((long)pvVar4 + 0x14) = (short)(int)fVar7;
    *(short *)((long)pvVar4 + 0x16) = (short)(int)fVar8;
    *(nk_handle *)((long)pvVar4 + 0x18) = usr;
    *(nk_command_custom_callback *)((long)pvVar4 + 0x20) = cb;
  }
  return;
}

Assistant:

NK_API void
nk_push_custom(struct nk_command_buffer *b, struct nk_rect r,
    nk_command_custom_callback cb, nk_handle usr)
{
    struct nk_command_custom *cmd;
    NK_ASSERT(b);
    if (!b) return;
    if (b->use_clipping) {
        const struct nk_rect *c = &b->clip;
        if (c->w == 0 || c->h == 0 || !NK_INTERSECT(r.x, r.y, r.w, r.h, c->x, c->y, c->w, c->h))
            return;
    }

    cmd = (struct nk_command_custom*)
        nk_command_buffer_push(b, NK_COMMAND_CUSTOM, sizeof(*cmd));
    if (!cmd) return;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)NK_MAX(0, r.w);
    cmd->h = (unsigned short)NK_MAX(0, r.h);
    cmd->callback_data = usr;
    cmd->callback = cb;
}